

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::TaskSet::Task::Task(Task *this,TaskSet *taskSet,Own<kj::_::PromiseNode> *nodeParam)

{
  PromiseNode *pPVar1;
  EventLoop *pEVar2;
  
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_004657e8;
  pEVar2 = anon_unknown_54::currentEventLoop();
  (this->super_Event).loop = pEVar2;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_00466188;
  (this->next).ptr.disposer = (Disposer *)0x0;
  (this->next).ptr.ptr = (Task *)0x0;
  this->prev = (Maybe<kj::Own<kj::TaskSet::Task>_> *)0x0;
  this->taskSet = taskSet;
  (this->node).disposer = nodeParam->disposer;
  (this->node).ptr = nodeParam->ptr;
  nodeParam->ptr = (PromiseNode *)0x0;
  pPVar1 = (this->node).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->node);
  pPVar1 = (this->node).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,this);
  return;
}

Assistant:

Task(TaskSet& taskSet, Own<_::PromiseNode>&& nodeParam)
      : taskSet(taskSet), node(kj::mv(nodeParam)) {
    node->setSelfPointer(&node);
    node->onReady(this);
  }